

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivateContainer::mousePressEvent(QComboBoxPrivateContainer *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QComboBox *pQVar5;
  long in_FS_OFFSET;
  QPointF local_e0;
  QPoint local_d0;
  QPoint local_c8;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff
  ;
  opt.super_QStyleOptionComplex.activeSubControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0x4;
  pQVar4 = QWidget::style(&this->combo->super_QWidget);
  this_00 = &this->combo->super_QWidget;
  local_e0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  local_d0 = QPointF::toPoint(&local_e0);
  local_c8 = QWidget::mapFromGlobal(this_00,&local_d0);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xd0))(pQVar4,1,&opt,&local_c8,this->combo);
  pQVar5 = this->combo;
  bVar2 = iVar3 != 4;
  if (*(long *)(*(long *)&(pQVar5->super_QWidget).field_0x8 + 0x2a0) == 0) {
    bVar2 = iVar3 == 0;
  }
  if (!bVar2) {
    QWidget::setAttribute((QWidget *)this,WA_NoMouseReplay,true);
    pQVar5 = this->combo;
  }
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x1b0))();
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::mousePressEvent(QMouseEvent *e)
{

    QStyleOptionComboBox opt = comboStyleOption();
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_ComboBoxArrow;
    QStyle::SubControl sc = combo->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt,
                                                           combo->mapFromGlobal(e->globalPosition().toPoint()),
                                                           combo);
    if ((combo->isEditable() && sc == QStyle::SC_ComboBoxArrow)
        || (!combo->isEditable() && sc != QStyle::SC_None))
        setAttribute(Qt::WA_NoMouseReplay);
    combo->hidePopup();
}